

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_StartUnion(void)

{
  bool bVar1;
  UnionStackEntry *pUVar2;
  int *piVar3;
  char *pcVar4;
  UnionStackEntry *entry;
  
  if (currentSection == (Section *)0x0) {
    error("UNIONs must be inside a SECTION\n");
  }
  else {
    bVar1 = sect_HasData(currentSection->type);
    if (bVar1) {
      error("Cannot use UNION inside of ROM0 or ROMX sections\n");
    }
    else {
      pUVar2 = (UnionStackEntry *)malloc(0x10);
      if (pUVar2 == (UnionStackEntry *)0x0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fatalerror("Failed to allocate new union stack entry: %s\n",pcVar4);
      }
      pUVar2->start = curOffset;
      pUVar2->size = 0;
      pUVar2->next = unionStack;
      unionStack = pUVar2;
    }
  }
  return;
}

Assistant:

void sect_StartUnion(void)
{
	// Important info: currently, UNION and LOAD cannot interact, since UNION is prohibited in
	// "code" sections, whereas LOAD is restricted to them.
	// Therefore, any interactions are NOT TESTED, so lift either of those restrictions at
	// your own peril! ^^

	if (!currentSection) {
		error("UNIONs must be inside a SECTION\n");
		return;
	}
	if (sect_HasData(currentSection->type)) {
		error("Cannot use UNION inside of ROM0 or ROMX sections\n");
		return;
	}
	struct UnionStackEntry *entry = (struct UnionStackEntry *)malloc(sizeof(*entry));

	if (!entry)
		fatalerror("Failed to allocate new union stack entry: %s\n", strerror(errno));
	entry->start = curOffset;
	entry->size = 0;
	entry->next = unionStack;
	unionStack = entry;
}